

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

uint16_t __thiscall CPU::ReadWord(CPU *this,uint16_t address)

{
  int iVar1;
  uint uVar2;
  
  this->cycles = this->cycles - 1;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])();
  this->cycles = this->cycles - 1;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(address + 1 & 0xffff));
  return (ushort)((uVar2 & 0xff) << 8) | (ushort)iVar1 & 0xff;
}

Assistant:

uint16_t CPU::ReadWord(uint16_t address)
{
    return (uint16_t)(ReadByte(address) | (ReadByte(address + 1) << 8));
}